

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

bool __thiscall SQClass::SetAttributes(SQClass *this,SQObjectPtr *key,SQObjectPtr *val)

{
  bool bVar1;
  SQClassMember *this_00;
  SQObjectPtr *in_RDX;
  SQObjectPtr *in_RDI;
  SQObjectPtr idx;
  SQClassMember *in_stack_ffffffffffffff90;
  SQObjectPtr *in_stack_ffffffffffffff98;
  SQObjectPtr *in_stack_ffffffffffffffa0;
  SQObjectPtr *this_01;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  SQObjectPtr local_30;
  SQObjectPtr *local_20;
  byte local_1;
  
  this_01 = &local_30;
  local_20 = in_RDX;
  ::SQObjectPtr::SQObjectPtr(this_01);
  bVar1 = SQTable::Get((SQTable *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                       this_01,in_RDI);
  if (bVar1) {
    if ((local_30.super_SQObject._unVal.nInteger & 0x2000000U) == 0) {
      in_stack_ffffffffffffff90 =
           sqvector<SQClassMember>::operator[]
                     ((sqvector<SQClassMember> *)&in_RDI[5].super_SQObject._unVal,
                      (ulong)(local_30.super_SQObject._unVal._0_4_ & 0xffffff));
      ::SQObjectPtr::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    else {
      this_00 = sqvector<SQClassMember>::operator[]
                          ((sqvector<SQClassMember> *)(in_RDI + 4),
                           (ulong)(local_30.super_SQObject._unVal._0_4_ & 0xffffff));
      ::SQObjectPtr::operator=(&this_00->val,local_20);
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
  ::SQObjectPtr::~SQObjectPtr(&in_stack_ffffffffffffff90->val);
  return (bool)(local_1 & 1);
}

Assistant:

bool SQClass::SetAttributes(const SQObjectPtr &key,const SQObjectPtr &val)
{
    SQObjectPtr idx;
    if(_members->Get(key,idx)) {
        if(_isfield(idx))
            _defaultvalues[_member_idx(idx)].attrs = val;
        else
            _methods[_member_idx(idx)].attrs = val;
        return true;
    }
    return false;
}